

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_signal.hpp
# Opt level: O0

int __thiscall
Signal<std::shared_ptr<Reaction>_>::ConnectMember<Gillespie>
          (Signal<std::shared_ptr<Reaction>_> *this,Gillespie *inst,offset_in_Gillespie_to_subr func
          )

{
  int iVar1;
  anon_class_24_2_3f47e9d7 local_70;
  function<void_(std::shared_ptr<Reaction>)> local_58;
  offset_in_Gillespie_to_subr local_38;
  offset_in_Gillespie_to_subr func_local;
  Gillespie *local_28;
  Gillespie *inst_local;
  Signal<std::shared_ptr<Reaction>_> *this_local;
  
  local_70.inst = inst;
  local_70.func = func;
  local_38 = func;
  local_28 = inst;
  inst_local = (Gillespie *)this;
  this_local = (Signal<std::shared_ptr<Reaction>_> *)func;
  std::function<void(std::shared_ptr<Reaction>)>::
  function<Signal<std::shared_ptr<Reaction>>::ConnectMember<Gillespie>(Gillespie*,void(Gillespie::*)(std::shared_ptr<Reaction>))::_lambda(std::shared_ptr<Reaction>)_1_,void>
            ((function<void(std::shared_ptr<Reaction>)> *)&local_58,&local_70);
  iVar1 = Connect(this,&local_58);
  std::function<void_(std::shared_ptr<Reaction>)>::~function(&local_58);
  return iVar1;
}

Assistant:

int ConnectMember(T *inst, void (T::*func)(Args...)) {
    return Connect([=](Args... args) { (inst->*func)(args...); });
  }